

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptimeprofiler.c
# Opt level: O2

PTimeProfiler * p_time_profiler_new(void)

{
  PTimeProfiler *pPVar1;
  puint64 pVar2;
  
  pPVar1 = (PTimeProfiler *)p_malloc0(8);
  if (pPVar1 == (PTimeProfiler *)0x0) {
    printf("** Error: %s **\n","PTimeProfiler: failed to allocate memory");
  }
  else {
    pVar2 = p_time_profiler_get_ticks_internal();
    pPVar1->counter = pVar2;
  }
  return pPVar1;
}

Assistant:

P_LIB_API PTimeProfiler *
p_time_profiler_new ()
{
	PTimeProfiler *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PTimeProfiler))) == NULL)) {
		P_ERROR ("PTimeProfiler: failed to allocate memory");
		return NULL;
	}

	ret->counter = p_time_profiler_get_ticks_internal ();

	return ret;
}